

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroStoreUnaligned
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  string *psVar1;
  undefined4 in_register_0000000c;
  uint in_R8D;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_208;
  char *local_1d0;
  char *local_1c8;
  AssemblyTemplateArgument local_1a8;
  char *local_180;
  string local_178 [32];
  char *local_158;
  string local_150;
  char *local_130;
  string local_128 [32];
  char *local_108;
  string local_100 [32];
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  string macroText;
  unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> local_a8 [3];
  char *local_90;
  char *templateWord;
  char *templateHalfword;
  string local_78 [4];
  int type;
  string size;
  string op;
  char *selectedTemplate;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  std::__cxx11::string::string((string *)(size.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  templateHalfword._4_4_ = in_R8D & 0xf;
  if (templateHalfword._4_4_ == 3) {
    templateWord = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\tsb\t\t%rd%,%off%(%rs%)\n\t\t\t\tsrl\t\tr1,%rd%,8\n\t\t\t\tsb\t\tr1,%off%+1(%rs%)\n\t\t\t.endif\n\t\t"
    ;
    op.field_2._8_8_ = anon_var_dwarf_299763;
  }
  else {
    if ((templateHalfword._4_4_ != 5) && (templateHalfword._4_4_ != 7)) {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
      macroText.field_2._12_4_ = 1;
      goto LAB_00214dbd;
    }
    local_90 = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\t%op%l\t%rd%,%off%+%size%-1(%rs%)\n\t\t\t\t%op%r\t%rd%,%off%(%rs%)\n\t\t\t.endif\n\t\t"
    ;
    if ((immediates->secondary).type ==
        *(MipsImmediateType *)
         &immediates[1].secondary.expression.expression.
          super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      Logger::printError<>(Error,"Cannot use same register as source and destination");
      std::make_unique<DummyCommand>();
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 local_a8);
      std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr(local_a8);
      macroText.field_2._12_4_ = 1;
      goto LAB_00214dbd;
    }
    if (templateHalfword._4_4_ == 5) {
      local_1c8 = "usw";
    }
    else {
      local_1c8 = "usd";
    }
    local_1c8 = local_1c8 + 1;
    std::__cxx11::string::operator=((string *)(size.field_2._M_local_buf + 8),local_1c8);
    if (templateHalfword._4_4_ == 5) {
      local_1d0 = "4";
    }
    else {
      local_1d0 = "8";
    }
    std::__cxx11::string::operator=(local_78,local_1d0);
    op.field_2._8_8_ = local_90;
  }
  preprocessMacro_abi_cxx11_
            ((string *)local_d0,(char *)op.field_2._8_8_,
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_1a8.variableName = "%rs%";
  psVar1 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
  std::__cxx11::string::string((string *)&local_1a8.value,(string *)psVar1);
  local_180 = "%rd%";
  psVar1 = Identifier::string_abi_cxx11_
                     ((Identifier *)&immediates[1].primary.expression.constExpression);
  std::__cxx11::string::string(local_178,(string *)psVar1);
  local_158 = "%off%";
  Expression::toString_abi_cxx11_
            (&local_150,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->primary).expression);
  local_130 = "%op%";
  std::__cxx11::string::string(local_128,(string *)(size.field_2._M_local_buf + 8));
  local_108 = "%size%";
  std::__cxx11::string::string(local_100,local_78);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_e0._0_8_ = &local_1a8;
  local_e0._8_8_ = 5;
  variables._M_len = local_e0._0_8_;
  createMacro(parser,(string *)registers,(int)local_d0,variables);
  local_208 = (AssemblyTemplateArgument *)local_e0;
  do {
    local_208 = local_208 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_208);
  } while (local_208 != &local_1a8);
  macroText.field_2._12_4_ = 1;
  std::__cxx11::string::~string((string *)local_d0);
LAB_00214dbd:
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(size.field_2._M_local_buf + 8));
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroStoreUnaligned(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	std::string op, size;
	int type = flags & MIPSM_ACCESSMASK;
	if (type == MIPSM_HW)
	{
		const char* templateHalfword = R"(
			.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				sb		%rd%,%off%(%rs%)
				srl		r1,%rd%,8
				sb		r1,%off%+1(%rs%)
			.endif
		)";

		selectedTemplate = templateHalfword;
	} else if (type == MIPSM_W || type == MIPSM_DW)
	{
		const char* templateWord = R"(
			.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				%op%l	%rd%,%off%+%size%-1(%rs%)
				%op%r	%rd%,%off%(%rs%)
			.endif
		)";

		if (registers.grs.num == registers.grd.num)
		{
			Logger::printError(Logger::Error, "Cannot use same register as source and destination");
			return std::make_unique<DummyCommand>();
		}

		op = type == MIPSM_W ? "sw" : "sd";
		size = type == MIPSM_W ? "4" : "8";
		selectedTemplate = templateWord;
	} else {
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rs%",		registers.grs.name.string() },
			{ "%rd%",		registers.grd.name.string() },
			{ "%off%",		immediates.primary.expression.toString() },
			{ "%op%",		op },
			{ "%size%",	size },
	});
}